

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

int sx_vsnprintf(char *str,int size,char *fmt,__va_list_tag *args)

{
  char *buf;
  stbsp__context c;
  char *local_238;
  int local_230;
  char local_22c [516];
  
  if (str == (char *)0x0 && size == 0) {
    local_230 = 0;
    stbsp_vsprintfcb(stbsp__count_clamp_callback,&local_238,local_22c,fmt,args);
  }
  else if (size == 0) {
    local_230 = 0;
  }
  else {
    local_238 = str;
    local_230 = size;
    buf = stbsp__clamp_callback((char *)0x0,&local_238,0);
    stbsp_vsprintfcb(stbsp__clamp_callback,&local_238,buf,fmt,args);
    local_238._0_4_ = (int)local_238 - (int)str;
    local_230 = size + -1;
    if ((int)local_238 < size) {
      local_230 = (int)local_238;
    }
    str[local_230] = '\0';
  }
  return local_230;
}

Assistant:

int sx_vsnprintf(char* str, int size, const char* fmt, va_list args)
{
    return stbsp_vsnprintf(str, size, fmt, args);
}